

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAMAdapter::getKappa(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  undefined8 local_e0;
  EAMAdapter *in_stack_ffffffffffffffa8;
  
  getZhouParam(in_stack_ffffffffffffffa8);
  ZhouParameters::~ZhouParameters(local_e0);
  return (RealType)local_e0;
}

Assistant:

RealType EAMAdapter::getKappa() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.kappa;
  }